

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase393::run(TestCase393 *this)

{
  Reader reader_00;
  SegmentBuilder *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  ReaderOptions options;
  ArrayPtr<capnp::word> scratchSpace;
  TestPipe pipe;
  TestMessageBuilder builder;
  PackedMessageReader reader;
  word scratch [1024];
  undefined1 local_2308 [8];
  OutputStream OStack_2300;
  WirePointer *local_22f8;
  _Alloc_hider local_22f0;
  uchar *local_22e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_22e0;
  size_type local_22d0;
  Reader local_22c8;
  StructReader local_22a8;
  PointerReader local_2278;
  TestMessageBuilder local_2250;
  PackedMessageReader local_2158;
  undefined1 local_2018 [8200];
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_2250.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_2250.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_00378da8;
  local_2250.desiredSegmentCount = 1;
  MessageBuilder::getRootInternal((Builder *)local_2308,(MessageBuilder *)&local_2250);
  local_2158.super_InputStreamMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)local_22f8;
  local_2158.super_PackedInputStream.super_InputStream._vptr_InputStream = (_func_int **)local_2308;
  local_2158.super_PackedInputStream.inner = (BufferedInputStream *)OStack_2300._vptr_OutputStream;
  PointerBuilder::initStruct
            ((StructBuilder *)local_2018,(PointerBuilder *)&local_2158,(StructSize)0x140006);
  paVar2 = &local_22e0;
  local_2308 = (undefined1  [8])&PTR__TestPipe_00378cd0;
  OStack_2300._vptr_OutputStream = (_func_int **)&PTR__TestPipe_00378d10;
  local_22f8 = (WirePointer *)0xffffffffffffffff;
  local_22e8 = (uchar *)0x0;
  local_22e0._M_local_buf[0] = '\0';
  local_22d0 = 0;
  local_22f0._M_p = (pointer)paVar2;
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_2250);
  segments_01.ptr = (ArrayPtr<const_capnp::word> *)AVar3.size_;
  segments_01.size_ = (size_t)paVar2;
  writePackedMessage((capnp *)&OStack_2300,(OutputStream *)AVar3.ptr,segments_01);
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_2250);
  segments.size_ = (ArrayPtr<const_capnp::word> *)AVar3.size_;
  segments.ptr = segments.size_;
  pSVar1 = (SegmentBuilder *)computeSerializedSizeInWords((capnp *)AVar3.ptr,segments);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = local_22e8;
  local_2018._8_8_ = computeUnpackedSizeInWords((capnp *)local_22f0._M_p,packedBytes);
  local_2018._16_8_ = " == ";
  local_2018._24_8_ = &DAT_00000005;
  local_2018[0x20] = pSVar1 == (SegmentBuilder *)local_2018._8_8_;
  local_2018._0_8_ = pSVar1;
  if ((!local_2018[0x20]) && (kj::_::Debug::minSeverity < 3)) {
    AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_2250);
    segments_00.size_ = (ArrayPtr<const_capnp::word> *)AVar3.size_;
    segments_00.ptr = segments_00.size_;
    local_2158.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeSerializedSizeInWords((capnp *)AVar3.ptr,segments_00);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = local_22e8;
    local_2278.segment =
         (SegmentReader *)computeUnpackedSizeInWords((capnp *)local_22f0._M_p,packedBytes_00);
    kj::_::Debug::
    log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,400,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)local_2018,
               (unsigned_long *)&local_2158,(unsigned_long *)&local_2278);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  scratchSpace.size_ = 0x400;
  scratchSpace.ptr = (word *)local_2018;
  PackedMessageReader::PackedMessageReader
            (&local_2158,(BufferedInputStream *)local_2308,options,scratchSpace);
  MessageReader::getRootInternal
            (&local_22c8,&local_2158.super_InputStreamMessageReader.super_MessageReader);
  local_2278.pointer = local_22c8.reader.pointer;
  local_2278.nestingLimit = local_22c8.reader.nestingLimit;
  local_2278._28_4_ = local_22c8.reader._28_4_;
  local_2278.segment = local_22c8.reader.segment;
  local_2278.capTable = local_22c8.reader.capTable;
  PointerReader::getStruct(&local_22a8,&local_2278,(word *)0x0);
  reader_00._reader.capTable = local_22a8.capTable;
  reader_00._reader.segment = local_22a8.segment;
  reader_00._reader.data = local_22a8.data;
  reader_00._reader.pointers = local_22a8.pointers;
  reader_00._reader.dataSize = local_22a8.dataSize;
  reader_00._reader.pointerCount = local_22a8.pointerCount;
  reader_00._reader._38_2_ = local_22a8._38_2_;
  reader_00._reader.nestingLimit = local_22a8.nestingLimit;
  reader_00._reader._44_4_ = local_22a8._44_4_;
  checkTestMessageAllZero(reader_00);
  PackedMessageReader::~PackedMessageReader(&local_2158);
  TestPipe::~TestPipe((TestPipe *)local_2308);
  TestMessageBuilder::~TestMessageBuilder(&local_2250);
  return;
}

Assistant:

TEST(Packed, RoundTripAllZeroScratchSpace) {
  TestMessageBuilder builder(1);
  builder.initRoot<TestAllTypes>();

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  word scratch[1024];
  PackedMessageReader reader(pipe, ReaderOptions(), kj::ArrayPtr<word>(scratch, 1024));
  checkTestMessageAllZero(reader.getRoot<TestAllTypes>());
}